

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetNavID(ImGuiID id,int nav_layer,ImGuiID focus_scope_id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->NavWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x22d9,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  if ((uint)nav_layer < 2) {
    GImGui->NavId = id;
    pIVar2->NavFocusScopeId = focus_scope_id;
    pIVar1->NavLastIds[(uint)nav_layer] = id;
    return;
  }
  __assert_fail("nav_layer == 0 || nav_layer == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x22da,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
}

Assistant:

void ImGui::SetNavID(ImGuiID id, int nav_layer, ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}